

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_array_ops.cpp
# Opt level: O0

Read<double> __thiscall
Omega_h::add_each<double>(Omega_h *this,Read<double> *a,Read<double> *b,string *name)

{
  void **this_00;
  void *extraout_RDX;
  Read<double> RVar1;
  Write<double> local_100 [2];
  undefined1 local_e0 [8];
  type f;
  Write<double> c;
  string *name_local;
  Read<double> *b_local;
  Read<double> *a_local;
  ulong local_40;
  ulong local_30;
  ulong local_20;
  ulong local_10;
  
  if (((ulong)(a->write_).shared_alloc_.alloc & 1) == 0) {
    local_10 = ((a->write_).shared_alloc_.alloc)->size;
  }
  else {
    local_10 = (ulong)(a->write_).shared_alloc_.alloc >> 3;
  }
  if (((ulong)(b->write_).shared_alloc_.alloc & 1) == 0) {
    local_20 = ((b->write_).shared_alloc_.alloc)->size;
  }
  else {
    local_20 = (ulong)(b->write_).shared_alloc_.alloc >> 3;
  }
  if ((int)(local_10 >> 3) == (int)(local_20 >> 3)) {
    if (((ulong)(a->write_).shared_alloc_.alloc & 1) == 0) {
      local_30 = ((a->write_).shared_alloc_.alloc)->size;
    }
    else {
      local_30 = (ulong)(a->write_).shared_alloc_.alloc >> 3;
    }
    this_00 = &f.b.write_.shared_alloc_.direct_ptr;
    Write<double>::Write((Write<double> *)this_00,(LO)(local_30 >> 3),name);
    Write<double>::Write((Write<double> *)local_e0,(Write<double> *)this_00);
    Read<double>::Read((Read<double> *)&f.c.shared_alloc_.direct_ptr,a);
    Read<double>::Read((Read<double> *)&f.a.write_.shared_alloc_.direct_ptr,b);
    if (((ulong)f.b.write_.shared_alloc_.direct_ptr & 1) == 0) {
      local_40 = *f.b.write_.shared_alloc_.direct_ptr;
    }
    else {
      local_40 = (ulong)f.b.write_.shared_alloc_.direct_ptr >> 3;
    }
    parallel_for<Omega_h::add_each<double>(Omega_h::Read<double>,Omega_h::Read<double>,std::__cxx11::string_const&)::_lambda(int)_1_>
              ((LO)(local_40 >> 3),(type *)local_e0,"add_each");
    Write<double>::Write(local_100,(Write<signed_char> *)&f.b.write_.shared_alloc_.direct_ptr);
    Read<double>::Read((Read<double> *)this,local_100);
    Write<double>::~Write(local_100);
    add_each<double>(Omega_h::Read<double>,Omega_h::Read<double>,std::__cxx11::string_const&)::
    {lambda(int)#1}::~basic_string((_lambda_int__1_ *)local_e0);
    Write<double>::~Write((Write<double> *)&f.b.write_.shared_alloc_.direct_ptr);
    RVar1.write_.shared_alloc_.direct_ptr = extraout_RDX;
    RVar1.write_.shared_alloc_.alloc = (Alloc *)this;
    return (Read<double>)RVar1.write_.shared_alloc_;
  }
  fail("assertion %s failed at %s +%d\n","a.size() == b.size()",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_array_ops.cpp"
       ,0xb6);
}

Assistant:

Read<T> add_each(Read<T> a, Read<T> b, std::string const& name) {
  OMEGA_H_CHECK(a.size() == b.size());
  Write<T> c(a.size(), name);
  auto f = OMEGA_H_LAMBDA(LO i) { c[i] = a[i] + b[i]; };
  parallel_for(c.size(), f, "add_each");
  return c;
}